

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.cpp
# Opt level: O2

int tinsert(lua_State *L)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint n;
  
  luaL_checktype(L,1,5);
  sVar2 = lua_objlen(L,1);
  uVar4 = (int)sVar2 + 1;
  iVar1 = lua_gettop(L);
  n = uVar4;
  if (iVar1 != 2) {
    if (iVar1 != 3) {
      iVar1 = luaL_error(L,"wrong number of arguments to \'insert\'");
      return iVar1;
    }
    uVar3 = luaL_checkinteger(L,2);
    n = (uint)uVar3;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 <= (int)n) {
      uVar5 = uVar3 & 0xffffffff;
    }
    while (iVar1 = (int)uVar5, (int)n < iVar1) {
      lua_rawgeti(L,1,iVar1 - 1U);
      lua_rawseti(L,1,iVar1);
      uVar5 = (ulong)(iVar1 - 1U);
    }
  }
  lua_rawseti(L,1,n);
  return 0;
}

Assistant:

static int tinsert (lua_State *L) {
  int e = aux_getn(L, 1) + 1;  /* first empty element */
  int pos;  /* where to insert new element */
  switch (lua_gettop(L)) {
    case 2: {  /* called with only 2 arguments */
      pos = e;  /* insert new element at the end */
      break;
    }
    case 3: {
      int i;
      pos = luaL_checkint(L, 2);  /* 2nd argument is the position */
      if (pos > e) e = pos;  /* `grow' array if necessary */
      for (i = e; i > pos; i--) {  /* move up elements */
        lua_rawgeti(L, 1, i-1);
        lua_rawseti(L, 1, i);  /* t[i] = t[i-1] */
      }
      break;
    }
    default: {
      return luaL_error(L, "wrong number of arguments to " LUA_QL("insert"));
    }
  }
  luaL_setn(L, 1, e);  /* new size */
  lua_rawseti(L, 1, pos);  /* t[pos] = v */
  return 0;
}